

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonASTNode.cpp
# Opt level: O0

void __thiscall CommonASTNode::initialize(CommonASTNode *this,RefToken *t)

{
  int iVar1;
  Token *pTVar2;
  RefCount<Token> *in_RSI;
  long *in_RDI;
  string local_30 [48];
  
  pTVar2 = RefCount<Token>::operator->(in_RSI);
  iVar1 = (*pTVar2->_vptr_Token[3])();
  (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1);
  pTVar2 = RefCount<Token>::operator->(in_RSI);
  (*pTVar2->_vptr_Token[2])();
  (**(code **)(*in_RDI + 0x38))(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CommonASTNode::initialize(RefToken t)
{
	setType(t->getType()); setText(t->getText());
}